

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O3

void __thiscall
icu_63::ContractionsAndExpansions::addStrings
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,UnicodeSet *set)

{
  short sVar1;
  UnicodeString *src;
  uint uVar2;
  int32_t srcLength;
  undefined4 uVar3;
  UnicodeString s;
  UnicodeString UStack_68;
  
  if (set != (UnicodeSet *)0x0) {
    UnicodeString::UnicodeString(&UStack_68,&this->unreversedPrefix);
    if (end <= start) {
      end = start;
    }
    do {
      UnicodeString::append(&UStack_68,start);
      src = this->suffix;
      if (src != (UnicodeString *)0x0) {
        sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          srcLength = (src->fUnion).fFields.fLength;
        }
        else {
          srcLength = (int)sVar1 >> 5;
        }
        UnicodeString::doAppend(&UStack_68,src,0,srcLength);
      }
      UnicodeSet::add(set,&UStack_68);
      sVar1 = (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar2 = (this->unreversedPrefix).fUnion.fFields.fLength;
      }
      else {
        uVar2 = (int)sVar1 >> 5;
      }
      if (uVar2 == 0 && (UStack_68.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
        UnicodeString::unBogus(&UStack_68);
      }
      else {
        uVar3 = UStack_68.fUnion.fFields.fLength;
        if (-1 < UStack_68.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)UStack_68.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (uVar2 < (uint)uVar3) {
          if ((int)uVar2 < 0x400) {
            UStack_68.fUnion.fStackFields.fLengthAndFlags =
                 (ushort)(uVar2 << 5) | UStack_68.fUnion.fStackFields.fLengthAndFlags & 0x1fU;
          }
          else {
            UStack_68.fUnion.fStackFields.fLengthAndFlags =
                 UStack_68.fUnion.fStackFields.fLengthAndFlags | 0xffe0;
            UStack_68.fUnion.fFields.fLength = uVar2;
          }
        }
      }
      start = start + 1;
    } while (end + 1 != start);
    UnicodeString::~UnicodeString(&UStack_68);
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::addStrings(UChar32 start, UChar32 end, UnicodeSet *set) {
    if(set == NULL) { return; }
    UnicodeString s(unreversedPrefix);
    do {
        s.append(start);
        if(suffix != NULL) {
            s.append(*suffix);
        }
        set->add(s);
        s.truncate(unreversedPrefix.length());
    } while(++start <= end);
}